

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::updateBanner(void)

{
  int iVar1;
  uint uVar2;
  char **ppcVar3;
  stringformatter local_120;
  char local_118 [8];
  string text;
  
  if ((updateBanner()::lastshow == '\0') &&
     (iVar1 = __cxa_guard_acquire(&updateBanner()::lastshow), iVar1 != 0)) {
    updateBanner::lastshow = lastmillis;
    __cxa_guard_release(&updateBanner()::lastshow);
  }
  iVar1 = vector<char_*>::length((vector<char_*> *)banners);
  if ((0 < iVar1) && (bannerintervolmillis <= lastmillis - updateBanner::lastshow)) {
    stringformatter::stringformatter(&local_120,local_118);
    uVar2 = randomMT();
    iVar1 = vector<char_*>::length((vector<char_*> *)banners);
    ppcVar3 = vector<char_*>::operator[]((vector<char_*> *)banners,(int)(uVar2 & 0xffffff) % iVar1);
    stringformatter::operator()(&local_120,"%s",*ppcVar3);
    sendservmsg(local_118);
    updateBanner::lastshow = lastmillis;
  }
  return;
}

Assistant:

void updateBanner()
    {
        static int lastshow = lastmillis;
        if(banners.length() > 0)
        {
            if((lastmillis-lastshow) >= bannerintervolmillis)
            {
                defformatstring(text)("%s", banners[rnd(banners.length())]);
                sendservmsg(text);
                lastshow = lastmillis;
            } else return;
        }
    }